

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmObjDate::load_image_data(CVmObjDate *this,char *ptr,size_t siz)

{
  vm_date_ext *pvVar1;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  pvVar1 = vm_date_ext::alloc_ext(this);
  (this->super_CVmObject).ext_ = (char *)pvVar1;
  pvVar1->dayno = *(int32_t *)ptr;
  pvVar1->daytime = *(int32_t *)(ptr + 4);
  return;
}

Assistant:

void CVmObjDate::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the image data */
    ext->dayno = osrp4s(ptr);
    ext->daytime = osrp4(ptr+4);
}